

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int ec_precompute_mont_data(EC_GROUP *group)

{
  int iVar1;
  BN_CTX *ctx_00;
  BN_MONT_CTX *pBVar2;
  long in_RDI;
  int ret;
  BN_CTX *ctx;
  undefined4 local_14;
  
  ctx_00 = BN_CTX_new();
  local_14 = 0;
  BN_MONT_CTX_free(*(BN_MONT_CTX **)(in_RDI + 0x48));
  *(undefined8 *)(in_RDI + 0x48) = 0;
  if (ctx_00 != (BN_CTX *)0x0) {
    pBVar2 = BN_MONT_CTX_new();
    *(BN_MONT_CTX **)(in_RDI + 0x48) = pBVar2;
    if (*(long *)(in_RDI + 0x48) != 0) {
      iVar1 = BN_MONT_CTX_set(*(BN_MONT_CTX **)(in_RDI + 0x48),*(BIGNUM **)(in_RDI + 0x10),ctx_00);
      if (iVar1 == 0) {
        BN_MONT_CTX_free(*(BN_MONT_CTX **)(in_RDI + 0x48));
        *(undefined8 *)(in_RDI + 0x48) = 0;
      }
      else {
        local_14 = 1;
      }
    }
  }
  BN_CTX_free(ctx_00);
  return local_14;
}

Assistant:

int ec_precompute_mont_data(EC_GROUP *group)
{
    BN_CTX *ctx = BN_CTX_new();
    int ret = GML_ERROR;

    BN_MONT_CTX_free(group->mont_data);
    group->mont_data = NULL;

    if (ctx == NULL)
        goto err;

    group->mont_data = BN_MONT_CTX_new();
    if (group->mont_data == NULL)
        goto err;

    if (!BN_MONT_CTX_set(group->mont_data, group->order, ctx)) {
        BN_MONT_CTX_free(group->mont_data);
        group->mont_data = NULL;
        goto err;
    }

    ret = GML_OK;

 err:

    BN_CTX_free(ctx);
    return ret;
}